

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O2

int dodrink(obj *potion)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  monst *pmVar4;
  char *pcVar5;
  code *pcVar6;
  
  if (u.uprops[0x22].intrinsic != 0) {
    pline("If you can\'t breathe air, how can you drink liquid?");
    return 0;
  }
  cVar1 = level->locations[u.ux][u.uy].typ;
  pcVar6 = (code *)0x0;
  if (((cVar1 == '\x1c') && (u.uprops[0x12].intrinsic == 0)) && (u.uprops[0x12].extrinsic == 0)) {
    if ((youmonst.data)->mlet == '\x05') {
      pcVar6 = (code *)0x0;
    }
    else {
      pcVar6 = drinkfountain;
    }
  }
  if (cVar1 == '\x1f') {
    pcVar6 = drinksink;
  }
  if (((u._1052_1_ & 2) != 0) &&
     (cVar1 = yn_function("Drink the water around you?","yn",'n'), cVar1 == 'y')) {
    if (urole.malenum == 0x159) {
      pcVar5 = "No thank you, fish make love in it!";
    }
    else {
      pcVar5 = "Do you know what lives in this water!?";
    }
    pline(pcVar5);
    return 1;
  }
  pcVar5 = "\x15\x16\b";
  if (pcVar6 == (code *)0x0) {
    pcVar5 = "\b";
  }
  if (potion == (obj *)0x0) {
    potion = getobj(pcVar5,"drink",(obj **)0x0);
    if (potion == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar2 = validate_object(potion,pcVar5,"drink");
    if (bVar2 == '\0') {
      return 0;
    }
  }
  if (potion == &zeroobj) {
    if (pcVar6 != (code *)0x0) {
      (*pcVar6)();
      return 1;
    }
    warning("dodrink: zeroobj selected without terrain");
    return 0;
  }
  potion->field_0x4c = potion->field_0x4c | 0x80;
  pcVar5 = obj_descr[objects[potion->otyp].oc_descr_idx].oc_descr;
  if (pcVar5 == (char *)0x0) {
LAB_0020e42b:
    iVar3 = dopotion(potion);
    return iVar3;
  }
  iVar3 = strcmp(pcVar5,"milky");
  if ((0x77 < flags.ghost_count || iVar3 != 0) ||
     (iVar3 = rn2(flags.ghost_count * 2 + 0xd), iVar3 != 0)) {
    iVar3 = strcmp(pcVar5,"smoky");
    if ((0x77 < flags.djinni_count || iVar3 != 0) ||
       (iVar3 = rn2(flags.djinni_count * 2 + 0xd), iVar3 != 0)) goto LAB_0020e42b;
    djinni_from_bottle(potion);
    goto LAB_0020e594;
  }
  pmVar4 = makemon(mons + 0x12a,level,(int)u.ux,(int)u.uy,0);
  if (pmVar4 == (monst *)0x0) {
    pcVar5 = "This bottle turns out to be empty.";
  }
  else {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020e4b7;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020e4b2;
LAB_0020e504:
      pcVar5 = "ghost";
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0')))) {
        pcVar5 = rndmonnam();
      }
      pline("As you open the bottle, an enormous %s emerges!",pcVar5);
      if (flags.verbose != '\0') {
        pline("You are frightened to death, and unable to move.");
      }
      nomul(-3,"being frightened to death");
      nomovemsg = "You regain your composure.";
      goto LAB_0020e594;
    }
LAB_0020e4b2:
    if (ublindf != (obj *)0x0) {
LAB_0020e4b7:
      if (ublindf->oartifact == '\x1d') goto LAB_0020e504;
    }
    pcVar5 = "As you open the bottle, something emerges.";
  }
  pline(pcVar5);
LAB_0020e594:
  useup(potion);
  return 1;
}

Assistant:

int dodrink(struct obj *potion)
{
	const char *potion_descr;
	void (*terrain)(void) = NULL;
	const char *drink_choices = NULL;

	if (Strangled) {
		pline("If you can't breathe air, how can you drink liquid?");
		return 0;
	}
	/* Is there a fountain to drink from here? */
	if (IS_FOUNTAIN(level->locations[u.ux][u.uy].typ) && !Levitation) {
		terrain = drinkfountain;
	}
	/* Or a kitchen sink? */
	if (IS_SINK(level->locations[u.ux][u.uy].typ)) {
		terrain = drinksink;
	}

	/* Or are you surrounded by water? */
	if (Underwater) {
		if (yn("Drink the water around you?") == 'y') {
			/* Indiana Jones 3 */
			if (Role_if(PM_ARCHEOLOGIST))
			    pline("No thank you, fish make love in it!");
			else
			    pline("Do you know what lives in this water!?");
			return 1;
		}
	}

	drink_choices = terrain ? beverages_and_fountains : beverages;
	if (potion && !validate_object(potion, drink_choices, "drink"))
		return 0;
	else if (!potion)
		potion = getobj(drink_choices, "drink", NULL);
	if (!potion) return 0;

	/* Quaff from fountains and sinks with "q," */
	if (potion == &zeroobj) {
	    if (!terrain) {
		warning("dodrink: zeroobj selected without terrain");
		return 0;
	    }
	    terrain();
	    return 1;
	}

	potion->in_use = TRUE;		/* you've opened the stopper */

#define POTION_OCCUPANT_CHANCE(n) (13 + 2*(n))	/* also in muse.c */

	potion_descr = OBJ_DESCR(objects[potion->otyp]);
	if (potion_descr) {
	    if (!strcmp(potion_descr, "milky") &&
		    flags.ghost_count < MAXMONNO &&
		    !rn2(POTION_OCCUPANT_CHANCE(flags.ghost_count))) {
		ghost_from_bottle();
		useup(potion);
		return 1;
	    } else if (!strcmp(potion_descr, "smoky") &&
		    flags.djinni_count < MAXMONNO &&
		    !rn2(POTION_OCCUPANT_CHANCE(flags.djinni_count))) {
		djinni_from_bottle(potion);
		useup(potion);
		return 1;
	    }
	}
	return dopotion(potion);
}